

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

CurrentAndTwoMoreIter * __thiscall
cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter::advance
          (CurrentAndTwoMoreIter *__return_storage_ptr__,CurrentAndTwoMoreIter *this,base_t *args)

{
  bool bVar1;
  _List_iterator<cmExpandedCommandArgument> _Var2;
  _Self local_58;
  _List_iterator<cmExpandedCommandArgument> local_50;
  _Self local_40;
  _List_iterator<cmExpandedCommandArgument> local_38;
  _List_node_base *local_30;
  _List_node_base *local_28;
  _List_node_base *local_20;
  list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *local_18;
  base_t *args_local;
  CurrentAndTwoMoreIter *this_local;
  
  local_28 = (this->current)._M_node;
  local_18 = args;
  args_local = (base_t *)this;
  local_20 = (_List_node_base *)
             std::next<std::_List_iterator<cmExpandedCommandArgument>>
                       ((_List_iterator<cmExpandedCommandArgument>)local_28,1);
  (this->current)._M_node = local_20;
  local_38._M_node = (this->current)._M_node;
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
       end(local_18);
  bVar1 = std::operator!=(&this->current,&local_40);
  local_30 = (_List_node_base *)
             std::next<std::_List_iterator<cmExpandedCommandArgument>>(local_38,(ulong)bVar1);
  (this->next)._M_node = local_30;
  local_50._M_node = (this->next)._M_node;
  local_58._M_node =
       (_List_node_base *)
       std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
       end(local_18);
  bVar1 = std::operator!=(&this->next,&local_58);
  _Var2 = std::next<std::_List_iterator<cmExpandedCommandArgument>>(local_50,(ulong)bVar1);
  (this->nextnext)._M_node = _Var2._M_node;
  (__return_storage_ptr__->current)._M_node = (this->current)._M_node;
  (__return_storage_ptr__->next)._M_node = (this->next)._M_node;
  (__return_storage_ptr__->nextnext)._M_node = (this->nextnext)._M_node;
  return __return_storage_ptr__;
}

Assistant:

CurrentAndTwoMoreIter advance(base_t& args)
    {
      this->current = std::next(this->current);
      this->next =
        std::next(this->current,
                  static_cast<difference_type>(this->current != args.end()));
      this->nextnext = std::next(
        this->next, static_cast<difference_type>(this->next != args.end()));
      return *this;
    }